

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helics-broker.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  ParseOutput PVar2;
  App *this;
  App *subcommand_description;
  App *pAVar3;
  Option *args;
  element_type *peVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  ostream *poVar6;
  invalid_argument *ia;
  HelicsException *he;
  BrokerKeeper broker;
  BrokerKeeper brkapp;
  shared_ptr<helics::apps::WebServer> webserver;
  ParseOutput parseResult;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000003c0;
  App *remote;
  App *term;
  helicsCLI11App cmdLine;
  string mWebSocketArgs;
  string mHttpArgs;
  bool websocket_server;
  bool http_server;
  bool autorestart;
  bool runremote;
  bool runterminal;
  int ret;
  string *in_stack_fffffffffffff528;
  helicsCLI11App *in_stack_fffffffffffff530;
  function<void_()> *in_stack_fffffffffffff538;
  App *in_stack_fffffffffffff540;
  allocator<char> *in_stack_fffffffffffff560;
  char *in_stack_fffffffffffff568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff570;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff578;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff580;
  undefined8 in_stack_fffffffffffff5b0;
  undefined1 config_required;
  undefined4 in_stack_fffffffffffff5b8;
  undefined4 in_stack_fffffffffffff5bc;
  helicsCLI11App *this_00;
  string *psVar7;
  allocator<char> *args_1;
  string *in_stack_fffffffffffff5f8;
  bool *in_stack_fffffffffffff600;
  helicsCLI11App *this_01;
  string *in_stack_fffffffffffff608;
  App *in_stack_fffffffffffff610;
  string *option_description;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *variable;
  string *in_stack_fffffffffffff6a0;
  string *in_stack_fffffffffffff6a8;
  int local_8ec;
  duration<long,std::ratio<1l,1l>> local_8e8 [12];
  int local_8dc;
  duration<long,std::ratio<1l,1l>> local_8d8 [12];
  int local_8cc;
  duration<long,std::ratio<1l,1l>> local_8c8 [104];
  undefined1 local_860 [16];
  __sv_type local_850;
  __sv_type local_840;
  string *in_stack_fffffffffffff7e0;
  string *in_stack_fffffffffffff7e8;
  undefined4 in_stack_fffffffffffff7f0;
  undefined4 in_stack_fffffffffffff7f4;
  undefined1 local_801 [40];
  string local_7d9;
  undefined1 local_7b1 [120];
  allocator<char> local_739 [40];
  undefined1 local_711 [80];
  allocator<char> local_6c1 [40];
  allocator<char> local_699 [40];
  allocator<char> local_671 [40];
  allocator<char> local_649 [40];
  string local_621;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f9;
  string local_5d1;
  undefined1 local_5a9 [73];
  byte *local_560;
  allocator<char> local_531 [40];
  allocator<char> local_509 [88];
  undefined1 local_4b1 [88];
  allocator<char> local_459 [56];
  allocator<char> local_421 [33];
  helicsCLI11App local_400;
  byte local_19;
  byte local_18;
  byte local_17;
  byte local_16;
  byte local_15;
  ParseOutput local_14;
  ParseOutput local_4;
  
  config_required = (undefined1)((ulong)in_stack_fffffffffffff5b0 >> 0x38);
  local_4 = 0;
  local_14 = OK;
  local_15 = 0;
  local_16 = 0;
  local_17 = 0;
  local_18 = 0;
  local_19 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff540);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff540);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff570,in_stack_fffffffffffff568,in_stack_fffffffffffff560);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff570,in_stack_fffffffffffff568,in_stack_fffffffffffff560);
  helics::helicsCLI11App::helicsCLI11App
            ((helicsCLI11App *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
             in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff530);
  std::allocator<char>::~allocator(local_459);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff530);
  std::allocator<char>::~allocator(local_421);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff570,in_stack_fffffffffffff568,in_stack_fffffffffffff560);
  pAVar3 = (App *)local_4b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff570,in_stack_fffffffffffff568,in_stack_fffffffffffff560);
  this = CLI::App::add_subcommand(pAVar3,in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0);
  subcommand_description = CLI::App::prefix_command(this,true);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff530);
  std::allocator<char>::~allocator((allocator<char> *)local_4b1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff530);
  std::allocator<char>::~allocator((allocator<char> *)(local_4b1 + 0x28));
  local_509._41_8_ = &local_15;
  local_4b1._73_8_ = subcommand_description;
  std::function<void()>::function<main::__0,void>
            ((function<void_()> *)in_stack_fffffffffffff540,
             (anon_class_8_1_73f87c67 *)in_stack_fffffffffffff538);
  CLI::App::callback(in_stack_fffffffffffff540,in_stack_fffffffffffff538);
  CLI::std::function<void_()>::~function((function<void_()> *)0x1842f5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff570,in_stack_fffffffffffff568,in_stack_fffffffffffff560);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff570,in_stack_fffffffffffff568,in_stack_fffffffffffff560);
  pAVar3 = CLI::App::add_subcommand(pAVar3,(string *)this,(string *)subcommand_description);
  pAVar3 = CLI::App::prefix_command(pAVar3,true);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff530);
  std::allocator<char>::~allocator(local_531);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff530);
  std::allocator<char>::~allocator(local_509);
  local_560 = &local_16;
  local_509._33_8_ = pAVar3;
  std::function<void()>::function<main::__1,void>
            ((function<void_()> *)in_stack_fffffffffffff540,
             (anon_class_8_1_1933e531 *)in_stack_fffffffffffff538);
  CLI::App::callback(in_stack_fffffffffffff540,in_stack_fffffffffffff538);
  CLI::std::function<void_()>::~function((function<void_()> *)0x184443);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff570,in_stack_fffffffffffff568,in_stack_fffffffffffff560);
  pAVar3 = (App *)local_5a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff570,in_stack_fffffffffffff568,in_stack_fffffffffffff560);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (in_stack_fffffffffffff610,in_stack_fffffffffffff608,in_stack_fffffffffffff600,
             in_stack_fffffffffffff5f8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff530);
  std::allocator<char>::~allocator((allocator<char> *)local_5a9);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff530);
  std::allocator<char>::~allocator((allocator<char> *)(local_5a9 + 0x28));
  psVar7 = &local_5d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff570,in_stack_fffffffffffff568,in_stack_fffffffffffff560);
  variable = &local_5f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff570,in_stack_fffffffffffff568,in_stack_fffffffffffff560);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (in_stack_fffffffffffff610,in_stack_fffffffffffff608,in_stack_fffffffffffff600,
             in_stack_fffffffffffff5f8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff530);
  std::allocator<char>::~allocator((allocator<char> *)&local_5f9);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff530);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
  option_description = &local_621;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff570,in_stack_fffffffffffff568,in_stack_fffffffffffff560);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff570,in_stack_fffffffffffff568,in_stack_fffffffffffff560);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (in_stack_fffffffffffff610,in_stack_fffffffffffff608,in_stack_fffffffffffff600,
             in_stack_fffffffffffff5f8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff530);
  std::allocator<char>::~allocator(local_649);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff530);
  std::allocator<char>::~allocator((allocator<char> *)&local_621);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff570,in_stack_fffffffffffff568,in_stack_fffffffffffff560);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff570,in_stack_fffffffffffff568,in_stack_fffffffffffff560);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar3,psVar7,variable,option_description);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff570,in_stack_fffffffffffff568,in_stack_fffffffffffff560);
  CLI::Option::envname((Option *)in_stack_fffffffffffff530,in_stack_fffffffffffff528);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff530);
  std::allocator<char>::~allocator(local_6c1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff530);
  std::allocator<char>::~allocator(local_699);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff530);
  std::allocator<char>::~allocator(local_671);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff570,in_stack_fffffffffffff568,in_stack_fffffffffffff560);
  this_01 = (helicsCLI11App *)local_711;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff570,in_stack_fffffffffffff568,in_stack_fffffffffffff560);
  args = CLI::App::
         add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                   (pAVar3,psVar7,variable,option_description);
  args_1 = local_739;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff570,in_stack_fffffffffffff568,in_stack_fffffffffffff560);
  CLI::Option::envname((Option *)in_stack_fffffffffffff530,in_stack_fffffffffffff528);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff530);
  std::allocator<char>::~allocator(local_739);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff530);
  std::allocator<char>::~allocator((allocator<char> *)local_711);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff530);
  std::allocator<char>::~allocator((allocator<char> *)(local_711 + 0x28));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff570,in_stack_fffffffffffff568,in_stack_fffffffffffff560);
  CLI::App::footer(&in_stack_fffffffffffff530->super_App,in_stack_fffffffffffff528);
  std::function<std::__cxx11::string()>::function<main::__2,void>
            ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
              *)in_stack_fffffffffffff540,(anon_class_1_0_00000001 *)in_stack_fffffffffffff538);
  CLI::App::footer(&in_stack_fffffffffffff530->super_App,
                   (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                    *)in_stack_fffffffffffff528);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
  ~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
             *)0x184973);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff530);
  std::allocator<char>::~allocator((allocator<char> *)(local_7b1 + 0x50));
  CLI::App::allow_extras(&local_400.super_App,true);
  pAVar3 = (App *)local_7b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff570,in_stack_fffffffffffff568,in_stack_fffffffffffff560);
  psVar7 = (string *)(local_801 + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff570,in_stack_fffffffffffff568,in_stack_fffffffffffff560);
  this_00 = (helicsCLI11App *)local_801;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff570,in_stack_fffffffffffff568,in_stack_fffffffffffff560);
  CLI::App::set_config
            (pAVar3,psVar7,(string *)this_00,
             (string *)CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8),
             (bool)config_required);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff530);
  std::allocator<char>::~allocator((allocator<char> *)local_801);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff530);
  std::allocator<char>::~allocator((allocator<char> *)(local_801 + 0x28));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff530);
  std::allocator<char>::~allocator((allocator<char> *)local_7b1);
  helics::helicsCLI11App::addSystemInfoCall(this_00);
  PVar2 = helics::helicsCLI11App::helics_parse<int&,char**&>(this_01,(int *)args,(char ***)args_1);
  if (PVar2 == OK) {
    CLI::std::shared_ptr<helics::apps::WebServer>::shared_ptr
              ((shared_ptr<helics::apps::WebServer> *)0x185118);
    if (((local_18 & 1) != 0) || ((local_19 & 1) != 0)) {
      CLI::std::make_shared<helics::apps::WebServer>();
      CLI::std::shared_ptr<helics::apps::WebServer>::operator=
                ((shared_ptr<helics::apps::WebServer> *)in_stack_fffffffffffff530,
                 (shared_ptr<helics::apps::WebServer> *)in_stack_fffffffffffff528);
      CLI::std::shared_ptr<helics::apps::WebServer>::~shared_ptr
                ((shared_ptr<helics::apps::WebServer> *)0x185171);
      peVar4 = CLI::std::
               __shared_ptr_access<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x18517e);
      helics::apps::WebServer::enableHttpServer(peVar4,(bool)(local_18 & 1));
      bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1851a0);
      if (!bVar1) {
        peVar4 = CLI::std::
                 __shared_ptr_access<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1851b1);
        local_840 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff530);
        (*(peVar4->super_TypedBrokerServer)._vptr_TypedBrokerServer[4])
                  (peVar4,local_840._M_len,local_840._M_str);
      }
      peVar4 = CLI::std::
               __shared_ptr_access<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x18521b);
      helics::apps::WebServer::enableWebSocketServer(peVar4,(bool)(local_19 & 1));
      bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x18523d);
      if (!bVar1) {
        peVar4 = CLI::std::
                 __shared_ptr_access<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x18524e);
        local_850 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff530);
        (*(peVar4->super_TypedBrokerServer)._vptr_TypedBrokerServer[4])
                  (peVar4,local_850._M_len,local_850._M_str);
      }
      in_stack_fffffffffffff580 =
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&stack0xfffffffffffff7e0;
      peVar4 = CLI::std::
               __shared_ptr_access<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1852a4);
      std::shared_ptr<helics::apps::TypedBrokerServer>::shared_ptr<helics::apps::WebServer,void>
                ((shared_ptr<helics::apps::TypedBrokerServer> *)in_stack_fffffffffffff530,
                 (shared_ptr<helics::apps::WebServer> *)in_stack_fffffffffffff528);
      (*(peVar4->super_TypedBrokerServer)._vptr_TypedBrokerServer[2])(peVar4,0,local_860);
      CLI::std::shared_ptr<helics::apps::TypedBrokerServer>::~shared_ptr
                ((shared_ptr<helics::apps::TypedBrokerServer> *)0x1852e6);
    }
    if ((local_15 & 1) == 0) {
      if ((local_16 & 1) == 0) {
        if ((local_17 & 1) != 0) {
          do {
            helics::helicsCLI11App::remainArgs_abi_cxx11_(&local_400);
            helics::BrokerKeeper::
            BrokerKeeper<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
                      ((BrokerKeeper *)in_stack_fffffffffffff530,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffff528);
            helics::BrokerKeeper::~BrokerKeeper((BrokerKeeper *)in_stack_fffffffffffff540);
            poVar6 = std::operator<<((ostream *)&std::cout,"broker restart in 3 seconds");
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            local_8cc = 1;
            std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(local_8c8,&local_8cc);
            std::this_thread::sleep_for<long,std::ratio<1l,1l>>
                      ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffff570);
            in_stack_fffffffffffff540 =
                 (App *)std::operator<<((ostream *)&std::cout,"broker restart in 2 seconds");
            std::ostream::operator<<
                      (in_stack_fffffffffffff540,std::endl<char,std::char_traits<char>>);
            local_8dc = 1;
            std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(local_8d8,&local_8dc);
            std::this_thread::sleep_for<long,std::ratio<1l,1l>>
                      ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffff570);
            poVar6 = std::operator<<((ostream *)&std::cout,"broker restart in 1 seconds");
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            local_8ec = 1;
            std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(local_8e8,&local_8ec);
            std::this_thread::sleep_for<long,std::ratio<1l,1l>>
                      ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffff570);
            in_stack_fffffffffffff530 =
                 (helicsCLI11App *)std::operator<<((ostream *)&std::cout,"broker restarting");
            std::ostream::operator<<
                      (in_stack_fffffffffffff530,std::endl<char,std::char_traits<char>>);
          } while( true );
        }
        pvVar5 = helics::helicsCLI11App::remainArgs_abi_cxx11_(&local_400);
        helics::BrokerKeeper::
        BrokerKeeper<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
                  ((BrokerKeeper *)in_stack_fffffffffffff530,pvVar5);
        helics::BrokerKeeper::~BrokerKeeper((BrokerKeeper *)in_stack_fffffffffffff540);
      }
      else {
        helics::helicsCLI11App::remainArgs_abi_cxx11_(&local_400);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(in_stack_fffffffffffff580,in_stack_fffffffffffff578);
        remoteTerminalFunction(in_stack_000003c0);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff540);
      }
    }
    else {
      pvVar5 = helics::helicsCLI11App::remainArgs_abi_cxx11_(&local_400);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(in_stack_fffffffffffff580,pvVar5);
      terminalFunction((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)brkapp.brk.broker.
                          super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                          ._M_pi);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff540);
    }
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&stack0xfffffffffffff7e0);
    if (bVar1) {
      peVar4 = CLI::std::
               __shared_ptr_access<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1854b7);
      (*(peVar4->super_TypedBrokerServer)._vptr_TypedBrokerServer[3])();
    }
    helics::cleanupHelicsLibrary();
    local_4 = local_14;
    CLI::std::shared_ptr<helics::apps::WebServer>::~shared_ptr
              ((shared_ptr<helics::apps::WebServer> *)0x185777);
  }
  else {
    local_4 = PVar2;
    if (OK < PVar2) {
      local_4 = OK;
    }
  }
  helics::helicsCLI11App::~helicsCLI11App(in_stack_fffffffffffff530);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff530);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff530);
  return local_4;
}

Assistant:

int main(int argc, char* argv[])  // NOLINT
{
    int ret{0};
    bool runterminal{false};
    bool runremote{false};
    bool autorestart{false};

    bool http_server{false};
    bool websocket_server{false};
#ifdef HELICS_ENABLE_WEBSERVER
    std::string mHttpArgs;
    std::string mWebSocketArgs;
#endif
    helics::helicsCLI11App cmdLine("helics broker command line");
    auto* term =
        cmdLine
            .add_subcommand(
                "term",
                "helics_broker term <broker args...> will start a broker and open a terminal control window "
                "for the broker run help in a terminal for more commands\n")
            ->prefix_command();
    term->callback([&runterminal]() { runterminal = true; });

    auto* remote =
        cmdLine
            .add_subcommand(
                "remote",
                "helics_broker remote <connection args>  will start a terminal and connect to a remote HELICS rest API and allow sending API commands through a terminal")
            ->prefix_command();
    remote->callback([&runremote]() { runremote = true; });

    cmdLine.add_flag(
        "--autorestart",
        autorestart,
        "helics_broker --autorestart <broker args ...> will start a continually regenerating broker "
        "there is a 3 second countdown on broker completion to halt the program via ctrl-C\n");

    cmdLine.add_flag("--http,--web",
                     http_server,
                     "start a webserver to respond to http rest api requests");
    cmdLine.add_flag("--websocket",
                     websocket_server,
                     "start a websocket server to respond to api requests");
#ifdef HELICS_ENABLE_WEBSERVER
    cmdLine
        .add_option("--http_server_args", mHttpArgs, "command line arguments for the http server")
        ->envname("HELICS_HTTP_ARGS");
    cmdLine
        .add_option("--websocket_server_args",
                    mWebSocketArgs,
                    "command line arguments for the websocket server")
        ->envname("HELICS_WEBSOCKET_ARGS");
#endif

    cmdLine
        .footer(
            "helics_broker <broker args ..> starts a broker with the given args and waits for it to "
            "complete\n")
        ->footer([]() {
            [[maybe_unused]] helics::BrokerApp app{"-?"};
            return std::string{};
        });
    cmdLine.allow_extras();
    cmdLine.set_config();
    cmdLine.addSystemInfoCall();
    auto parseResult = cmdLine.helics_parse(argc, argv);
    if (parseResult != helics::helicsCLI11App::ParseOutput::OK) {
        return (static_cast<int>(parseResult) > 0) ? 0 : static_cast<int>(parseResult);
    }
#ifdef HELICS_ENABLE_WEBSERVER
    std::shared_ptr<helics::apps::WebServer> webserver;
    if (http_server || websocket_server) {
        webserver = std::make_shared<helics::apps::WebServer>();
        webserver->enableHttpServer(http_server);
        if (!mHttpArgs.empty()) {
            webserver->processArgs(mHttpArgs);
        }
        webserver->enableWebSocketServer(websocket_server);
        if (!mWebSocketArgs.empty()) {
            webserver->processArgs(mWebSocketArgs);
        }
        webserver->startServer(nullptr, webserver);
    }
#else
    if (http_server || websocket_server) {
        std::cout
            << "the http webserver and websocket server are not available in this build please recompile with webserver enabled to utilize "
            << std::endl;
    }
#endif
    try {
        if (runterminal) {
            terminalFunction(cmdLine.remainArgs());
        } else if (runremote) {
            remoteTerminalFunction(cmdLine.remainArgs());
        } else if (autorestart) {
            while (true) {
                // I am purposely making an object that creates and destroys itself on the same line
                // because this will run until termination so will take a while
                {
                    helics::BrokerKeeper brkapp{cmdLine.remainArgs()};
                }
                std::cout << "broker restart in 3 seconds" << std::endl;
                std::this_thread::sleep_for(std::chrono::seconds(1));
                std::cout << "broker restart in 2 seconds" << std::endl;
                std::this_thread::sleep_for(std::chrono::seconds(1));
                std::cout << "broker restart in 1 seconds" << std::endl;
                std::this_thread::sleep_for(std::chrono::seconds(1));
                std::cout << "broker restarting" << std::endl;
            }
        } else {
            helics::BrokerKeeper broker(cmdLine.remainArgs());
        }
    }
    catch (const std::invalid_argument& ia) {
        std::cerr << ia.what() << std::endl;
        ret = -2;
    }
    catch (const helics::HelicsException& he) {
        std::cerr << he.what() << std::endl;
        ret = -4;
    }
#ifdef HELICS_ENABLE_WEBSERVER
    if (webserver) {
        webserver->stopServer();
    }
#endif
    helics::cleanupHelicsLibrary();
    return ret;
}